

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PowerDifferentiationTest.cpp
# Opt level: O0

int main(int param_1,char **param_2)

{
  int iVar1;
  double extraout_XMM0_Qa;
  Variable *variable;
  Variable *arg1;
  int *extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  Variable x;
  string *in_stack_fffffffffffffde8;
  undefined7 in_stack_fffffffffffffdf0;
  undefined1 in_stack_fffffffffffffdf7;
  undefined1 uVar2;
  char *in_stack_fffffffffffffdf8;
  allocator *paVar3;
  Variable *in_stack_fffffffffffffe20;
  int *arg2;
  Variable *in_stack_fffffffffffffe28;
  Variable *in_stack_fffffffffffffe30;
  undefined7 in_stack_fffffffffffffe38;
  undefined1 in_stack_fffffffffffffe3f;
  allocator local_199;
  string local_198 [36];
  undefined4 local_174;
  undefined1 local_148 [24];
  string local_130 [32];
  string local_110 [36];
  undefined4 local_ec;
  allocator local_a1;
  string local_a0 [36];
  undefined4 local_7c;
  undefined1 local_50 [76];
  int local_4;
  
  local_4 = 0;
  Kandinsky::Variable::Variable((Variable *)0x1294e3);
  Kandinsky::Variable::setValue
            ((Variable *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0),
             (double)in_stack_fffffffffffffde8);
  local_7c = 5;
  Kandinsky::pow<Kandinsky::Variable,_int,_nullptr>
            (in_stack_fffffffffffffe28,(int *)in_stack_fffffffffffffe20);
  Kandinsky::BaseExpression::differentiate
            ((BaseExpression *)CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38),
             in_stack_fffffffffffffe30);
  iVar1 = (int)local_50;
  Kandinsky::Expression::evaluate((Expression *)0x12954d);
  std::abs(iVar1);
  uVar2 = extraout_XMM0_Qa < 0.0001;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,"x = 3; d(pow(x,5))/dx != 405",&local_a1);
  Kandinsky::assertOrExit((bool)in_stack_fffffffffffffdf7,in_stack_fffffffffffffde8);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  Kandinsky::Expression::~Expression((Expression *)0x1295fa);
  Kandinsky::PowerExpression::~PowerExpression((PowerExpression *)0x129607);
  local_ec = 4;
  Kandinsky::pow<int,_Kandinsky::Variable,_nullptr>
            ((int *)in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
  Kandinsky::BaseExpression::differentiate
            ((BaseExpression *)CONCAT17(uVar2,in_stack_fffffffffffffe38),in_stack_fffffffffffffe30);
  variable = (Variable *)Kandinsky::Expression::evaluate((Expression *)0x12965d);
  iVar1 = 4;
  arg1 = (Variable *)std::log<int>(0);
  std::abs(iVar1);
  arg2 = extraout_XMM0_Qa_00;
  std::log<int>(0);
  std::__cxx11::to_string((double)in_stack_fffffffffffffdf8);
  std::operator+(in_stack_fffffffffffffdf8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0));
  Kandinsky::assertOrExit((bool)in_stack_fffffffffffffdf7,in_stack_fffffffffffffde8);
  std::__cxx11::string::~string(local_110);
  std::__cxx11::string::~string(local_130);
  Kandinsky::Expression::~Expression((Expression *)0x12974a);
  Kandinsky::PowerExpression::~PowerExpression((PowerExpression *)0x129757);
  Kandinsky::Variable::setValue
            ((Variable *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0),
             (double)in_stack_fffffffffffffde8);
  local_174 = 5;
  Kandinsky::pow<Kandinsky::Variable,_int,_nullptr>(arg1,arg2);
  Kandinsky::BaseExpression::differentiate
            ((BaseExpression *)CONCAT17(uVar2,in_stack_fffffffffffffe38),variable);
  iVar1 = (int)local_148;
  Kandinsky::Expression::evaluate((Expression *)0x1297bf);
  std::abs(iVar1);
  uVar2 = extraout_XMM0_Qa_01 < 0.0001;
  paVar3 = &local_199;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_198,"x = 0; d(pow(x,5))/dx != 0",paVar3);
  Kandinsky::assertOrExit((bool)uVar2,in_stack_fffffffffffffde8);
  std::__cxx11::string::~string(local_198);
  std::allocator<char>::~allocator((allocator<char> *)&local_199);
  Kandinsky::Expression::~Expression((Expression *)0x12985a);
  Kandinsky::PowerExpression::~PowerExpression((PowerExpression *)0x129867);
  local_4 = 0;
  Kandinsky::Variable::~Variable((Variable *)0x12987f);
  return local_4;
}

Assistant:

int main (int /*argc*/, char** /*argv*/)
{
    Variable x;
    x.setValue(3);
    assertOrExit(std::abs((pow(x, 5)).differentiate(x).evaluate() - 405) < 1.e-4, "x = 3; d(pow(x,5))/dx != 405");
    assertOrExit(std::abs((pow(4, x)).differentiate(x).evaluate() - 64*std::log(4)) < 1.e-4, "x = 3; d(pow(4,x))/dx != " + std::to_string(64*std::log(4)));
    x.setValue(0);
    assertOrExit(std::abs((pow(x, 5)).differentiate(x).evaluate() - 0) < 1.e-4, "x = 0; d(pow(x,5))/dx != 0");
    return 0;
}